

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom_parser.c
# Opt level: O2

int image_oprom_get_version(igsc_oprom_image *img,igsc_oprom_type type,igsc_oprom_version *version)

{
  igsc_oprom_version *piVar1;
  bool bVar2;
  igsc_oprom_type iVar3;
  int iVar4;
  
  iVar3 = image_oprom_get_type(img);
  if (iVar3 == IGSC_OPROM_NONE) {
    iVar4 = 5;
  }
  else if ((iVar3 & type) == IGSC_OPROM_NONE) {
    iVar4 = 9;
  }
  else {
    if (type == IGSC_OPROM_CODE) {
      if (version == (igsc_oprom_version *)0x0) {
        return 0;
      }
      piVar1 = &img->code_version;
      bVar2 = version + 1 <= piVar1;
      if (piVar1 < version) {
        bVar2 = (img->code_version).version + 7 < version;
      }
    }
    else {
      if (type != IGSC_OPROM_DATA) {
        return 3;
      }
      if (version == (igsc_oprom_version *)0x0) {
        return 0;
      }
      piVar1 = &img->data_version;
      bVar2 = version + 1 <= piVar1;
      if (piVar1 < version) {
        bVar2 = (img->data_version).version + 7 < version;
      }
    }
    iVar4 = 0;
    if (bVar2) {
      *(undefined8 *)version->version = *(undefined8 *)piVar1->version;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int image_oprom_get_version(struct igsc_oprom_image *img,
                            enum igsc_oprom_type type,
                            struct igsc_oprom_version *version)
{
    enum igsc_oprom_type img_type;

    img_type = image_oprom_get_type(img);
    if (img_type == IGSC_OPROM_NONE)
    {
        return IGSC_ERROR_BAD_IMAGE;
    }

    if ((img_type & type) == 0)
    {
        return IGSC_ERROR_NOT_SUPPORTED;
    }

    if (type == IGSC_OPROM_DATA)
    {
        gsc_memcpy_s(version, sizeof(*version),
                     &img->data_version,  sizeof(*version));
        return IGSC_SUCCESS;
    }
    else if (type == IGSC_OPROM_CODE)
    {
        gsc_memcpy_s(version, sizeof(*version),
                     &img->code_version,  sizeof(*version));
        return IGSC_SUCCESS;
    }

    return IGSC_ERROR_INVALID_PARAMETER;
}